

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadQuadMesh(XMLLoader *this,Ref<embree::XML> *xml)

{
  uint v0;
  uint v1;
  uint v2;
  uint v3;
  XMLLoader *pXVar1;
  QuadMeshNode *pQVar2;
  size_t sVar3;
  size_type siglen;
  reference pvVar4;
  undefined8 in_RDX;
  uchar *sig;
  Quad *in_RSI;
  Node *in_RDI;
  uchar *in_R8;
  size_t in_R9;
  size_t i_11;
  vector<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_> indices;
  size_t i_8;
  avector<Vec3fa> vec;
  Ref<embree::XML> normalbuf;
  size_t i_5;
  Ref<embree::XML> animation_1;
  size_t i;
  Ref<embree::XML> animation;
  Ref<embree::SceneGraph::QuadMeshNode> mesh;
  Ref<embree::SceneGraph::MaterialNode> material;
  size_t i_9;
  size_t i_10;
  size_t i_7;
  size_t i_6;
  size_t i_4;
  size_t i_3;
  size_t i_2;
  size_t i_1;
  value_type *in_stack_fffffffffffff778;
  vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
  *in_stack_fffffffffffff780;
  value_type *in_stack_fffffffffffff788;
  vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *in_stack_fffffffffffff790;
  string *in_stack_fffffffffffff7b0;
  XML *in_stack_fffffffffffff7b8;
  size_t in_stack_fffffffffffff808;
  Ref<embree::SceneGraph::MaterialNode> *in_stack_fffffffffffff810;
  QuadMeshNode *in_stack_fffffffffffff818;
  BBox1f in_stack_fffffffffffff820;
  allocator *paVar5;
  string *in_stack_fffffffffffff838;
  XML *in_stack_fffffffffffff840;
  size_t in_stack_fffffffffffff860;
  XML *in_stack_fffffffffffff868;
  ulong uVar6;
  Ref<embree::XML> *in_stack_fffffffffffff8a0;
  XMLLoader *in_stack_fffffffffffff8a8;
  QuadMeshNode *in_stack_fffffffffffff8d0;
  XMLLoader *in_stack_fffffffffffff8d8;
  QuadMeshNode *in_stack_fffffffffffff990;
  XMLLoader *in_stack_fffffffffffff998;
  Quad local_5e8;
  ulong local_5d8;
  allocator local_5c9;
  string local_5c8 [8];
  Ref<embree::XML> *in_stack_fffffffffffffa40;
  XMLLoader *in_stack_fffffffffffffa48;
  long *local_5a8;
  vector<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_> local_5a0;
  allocator local_581;
  string local_580 [32];
  long *local_560 [4];
  ulong local_540;
  undefined1 local_538 [8];
  ulong local_530;
  undefined8 local_528;
  undefined8 local_520;
  allocator local_511;
  string local_510 [32];
  long *local_4f0;
  long *local_4e8;
  undefined1 local_4e0 [8];
  ulong local_4d8;
  undefined8 local_4d0;
  undefined8 local_4c8;
  XMLLoader *local_4c0;
  allocator local_4b1;
  string local_4b0 [32];
  long *local_490;
  allocator local_481;
  string local_480 [32];
  long *local_460;
  undefined1 local_458 [8];
  ulong local_450;
  undefined8 local_448;
  undefined8 local_440;
  long *local_438;
  undefined1 local_430 [8];
  ulong local_428;
  undefined8 local_420;
  undefined8 local_418;
  XMLLoader *local_410;
  allocator local_401;
  string local_400 [32];
  long *local_3e0;
  undefined1 local_3d1;
  undefined4 local_3d0;
  undefined4 local_3cc;
  undefined4 local_3c8;
  undefined4 uStack_3c4;
  long *local_3c0;
  QuadMeshNode *local_3b8 [3];
  allocator local_399;
  string local_398 [32];
  long *local_378;
  long *local_370;
  undefined8 local_368;
  undefined8 local_350;
  undefined8 local_348;
  undefined8 local_340;
  undefined8 local_338;
  undefined8 local_330;
  undefined8 local_328;
  long **local_318;
  long **local_310;
  long **local_308;
  undefined1 *local_300;
  undefined1 *local_2f0;
  undefined1 *local_2e0;
  undefined1 *local_2d0;
  undefined1 *local_2c0;
  long **local_2b8;
  long **local_2a8;
  long **local_298;
  long **local_288;
  long **local_278;
  long **local_268;
  long **local_258;
  long **local_248;
  long **local_238;
  undefined4 *local_228;
  undefined4 *local_220;
  undefined4 *local_218;
  long **local_210;
  long **local_208;
  long **local_200;
  long **local_1f8;
  long **local_1f0;
  long **local_1e8;
  long **local_1e0;
  long **local_1d0;
  QuadMeshNode *local_1c0;
  QuadMeshNode **local_1b8;
  QuadMeshNode **local_1b0;
  QuadMeshNode **local_1a8;
  QuadMeshNode **local_1a0;
  QuadMeshNode **local_198;
  QuadMeshNode **local_190;
  QuadMeshNode **local_188;
  QuadMeshNode **local_180;
  QuadMeshNode **local_178;
  QuadMeshNode **local_170;
  QuadMeshNode *local_160;
  QuadMeshNode **local_150;
  ulong local_130;
  undefined1 *local_128;
  ulong local_110;
  undefined1 *local_108;
  ulong local_f0;
  undefined1 *local_e8;
  ulong local_d0;
  undefined1 *local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined1 *local_b0;
  undefined1 *local_80;
  undefined8 local_60;
  undefined8 local_58;
  undefined1 *local_50;
  undefined1 *local_20;
  
  local_368 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_398,"material",&local_399);
  XML::child(in_stack_fffffffffffff840,in_stack_fffffffffffff838);
  loadMaterial(in_stack_fffffffffffffa48,in_stack_fffffffffffffa40);
  local_2b8 = &local_378;
  if (local_378 != (long *)0x0) {
    (**(code **)(*local_378 + 0x18))();
  }
  std::__cxx11::string::~string(local_398);
  std::allocator<char>::~allocator((allocator<char> *)&local_399);
  pQVar2 = (QuadMeshNode *)::operator_new(0xd8);
  local_3d1 = 1;
  local_1e8 = &local_3c0;
  local_1f0 = &local_370;
  local_3c0 = local_370;
  if (local_370 != (long *)0x0) {
    (**(code **)(*local_370 + 0x10))();
  }
  local_3cc = 0;
  local_3d0 = 0x3f800000;
  local_218 = &local_3c8;
  local_220 = &local_3cc;
  local_228 = &local_3d0;
  local_3c8 = 0;
  uStack_3c4 = 0x3f800000;
  SceneGraph::QuadMeshNode::QuadMeshNode
            (in_stack_fffffffffffff818,in_stack_fffffffffffff810,in_stack_fffffffffffff820,
             in_stack_fffffffffffff808);
  local_3d1 = 0;
  local_1b8 = local_3b8;
  local_1c0 = pQVar2;
  local_3b8[0] = pQVar2;
  if (pQVar2 != (QuadMeshNode *)0x0) {
    (*(code *)(((XML *)(pQVar2->super_Node).super_RefCount._vptr_RefCount)->loc).fileName.
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)();
  }
  local_1e0 = &local_3c0;
  if (local_3c0 != (long *)0x0) {
    (**(code **)(*local_3c0 + 0x18))();
  }
  local_328 = local_368;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_400,"animated_positions",&local_401);
  XML::childOpt(in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0);
  std::__cxx11::string::~string(local_400);
  std::allocator<char>::~allocator((allocator<char> *)&local_401);
  local_308 = &local_3e0;
  if (local_3e0 == (long *)0x0) {
    local_180 = local_3b8;
    local_330 = local_368;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_480,"positions",&local_481);
    XML::childOpt(in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0);
    loadVec3faArray(in_stack_fffffffffffff998,(Ref<embree::XML> *)in_stack_fffffffffffff990);
    std::
    vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
    ::push_back((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                 *)in_stack_fffffffffffff780,in_stack_fffffffffffff778);
    local_2f0 = local_458;
    for (local_f0 = 0; local_f0 < local_450; local_f0 = local_f0 + 1) {
    }
    local_e8 = local_2f0;
    local_80 = local_2f0;
    alignedFree(in_stack_fffffffffffff778);
    local_440 = 0;
    local_448 = 0;
    local_450 = 0;
    local_298 = &local_460;
    if (local_460 != (long *)0x0) {
      (**(code **)(*local_460 + 0x18))();
    }
    std::__cxx11::string::~string(local_480);
    std::allocator<char>::~allocator((allocator<char> *)&local_481);
  }
  else {
    local_410 = (XMLLoader *)0x0;
    while( true ) {
      pXVar1 = local_410;
      local_1f8 = &local_3e0;
      in_stack_fffffffffffff998 = (XMLLoader *)XML::size((XML *)0x3e09e4);
      if (in_stack_fffffffffffff998 <= pXVar1) break;
      local_178 = local_3b8;
      local_200 = &local_3e0;
      in_stack_fffffffffffff990 = local_3b8[0];
      XML::child(in_stack_fffffffffffff868,in_stack_fffffffffffff860);
      loadVec3faArray(in_stack_fffffffffffff998,(Ref<embree::XML> *)in_stack_fffffffffffff990);
      std::
      vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
      ::push_back((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                   *)in_stack_fffffffffffff780,in_stack_fffffffffffff778);
      local_300 = local_430;
      for (local_d0 = 0; local_d0 < local_428; local_d0 = local_d0 + 1) {
      }
      local_c0 = local_420;
      local_b8 = local_418;
      local_c8 = local_300;
      local_b0 = local_300;
      alignedFree(in_stack_fffffffffffff778);
      local_418 = 0;
      local_420 = 0;
      local_428 = 0;
      local_2a8 = &local_438;
      if (local_438 != (long *)0x0) {
        (**(code **)(*local_438 + 0x18))();
      }
      local_410 = (XMLLoader *)&(local_410->path).filename.field_0x1;
    }
  }
  local_288 = &local_3e0;
  if (local_3e0 != (long *)0x0) {
    (**(code **)(*local_3e0 + 0x18))();
  }
  local_338 = local_368;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4b0,"animated_normals",&local_4b1);
  XML::childOpt(in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0);
  std::__cxx11::string::~string(local_4b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4b1);
  local_310 = &local_490;
  if (local_490 == (long *)0x0) {
    local_340 = local_368;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_510,"normals",&local_511);
    XML::childOpt(in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0);
    std::__cxx11::string::~string(local_510);
    std::allocator<char>::~allocator((allocator<char> *)&local_511);
    local_318 = &local_4f0;
    if (local_4f0 != (long *)0x0) {
      loadVec3faArray(in_stack_fffffffffffff998,(Ref<embree::XML> *)in_stack_fffffffffffff990);
      local_2c0 = local_538;
      if (local_530 != 0) {
        local_540 = 0;
        while( true ) {
          local_190 = local_3b8;
          uVar6 = local_540;
          sVar3 = SceneGraph::QuadMeshNode::numTimeSteps((QuadMeshNode *)0x3e1937);
          if (sVar3 <= uVar6) break;
          local_198 = local_3b8;
          std::
          vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
          ::push_back((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                       *)in_stack_fffffffffffff790,in_stack_fffffffffffff788);
          local_540 = local_540 + 1;
        }
      }
      local_2d0 = local_538;
      for (local_130 = 0; local_130 < local_530; local_130 = local_130 + 1) {
      }
      local_128 = local_2d0;
      local_20 = local_2d0;
      alignedFree(in_stack_fffffffffffff778);
      local_520 = 0;
      local_528 = 0;
      local_530 = 0;
    }
    local_268 = &local_4f0;
    if (local_4f0 != (long *)0x0) {
      (**(code **)(*local_4f0 + 0x18))();
    }
  }
  else {
    local_4c0 = (XMLLoader *)0x0;
    while( true ) {
      pXVar1 = local_4c0;
      local_208 = &local_490;
      in_stack_fffffffffffff8d8 = (XMLLoader *)XML::size((XML *)0x3e13da);
      if (in_stack_fffffffffffff8d8 <= pXVar1) break;
      local_188 = local_3b8;
      local_210 = &local_490;
      in_stack_fffffffffffff8d0 = local_3b8[0];
      XML::child(in_stack_fffffffffffff868,in_stack_fffffffffffff860);
      loadVec3faArray(in_stack_fffffffffffff998,(Ref<embree::XML> *)in_stack_fffffffffffff990);
      std::
      vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
      ::push_back((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                   *)in_stack_fffffffffffff780,in_stack_fffffffffffff778);
      local_2e0 = local_4e0;
      for (local_110 = 0; local_110 < local_4d8; local_110 = local_110 + 1) {
      }
      local_60 = local_4d0;
      local_58 = local_4c8;
      local_108 = local_2e0;
      local_50 = local_2e0;
      alignedFree(in_stack_fffffffffffff778);
      local_4c8 = 0;
      local_4d0 = 0;
      local_4d8 = 0;
      local_278 = &local_4e8;
      if (local_4e8 != (long *)0x0) {
        (**(code **)(*local_4e8 + 0x18))();
      }
      local_4c0 = (XMLLoader *)&(local_4c0->path).filename.field_0x1;
    }
  }
  local_258 = &local_490;
  if (local_490 != (long *)0x0) {
    (**(code **)(*local_490 + 0x18))();
  }
  local_348 = local_368;
  paVar5 = &local_581;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_580,"texcoords",paVar5);
  XML::childOpt(in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0);
  loadVec2fArray(in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0);
  local_1a0 = local_3b8;
  std::vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>::operator=
            (in_stack_fffffffffffff790,
             (vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *)
             in_stack_fffffffffffff788);
  std::vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>::~vector
            (in_stack_fffffffffffff790);
  local_248 = local_560;
  if (local_560[0] != (long *)0x0) {
    (**(code **)(*local_560[0] + 0x18))();
  }
  std::__cxx11::string::~string(local_580);
  std::allocator<char>::~allocator((allocator<char> *)&local_581);
  local_350 = local_368;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5c8,"indices",&local_5c9);
  XML::childOpt(in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0);
  loadVec4iArray(in_stack_fffffffffffff8d8,(Ref<embree::XML> *)in_stack_fffffffffffff8d0);
  local_238 = &local_5a8;
  if (local_5a8 != (long *)0x0) {
    (**(code **)(*local_5a8 + 0x18))();
  }
  std::__cxx11::string::~string(local_5c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5c9);
  for (local_5d8 = 0; uVar6 = local_5d8,
      siglen = std::vector<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>::size(&local_5a0)
      , uVar6 < siglen; local_5d8 = local_5d8 + 1) {
    local_1a8 = local_3b8;
    pvVar4 = std::vector<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>::operator[]
                       (&local_5a0,local_5d8);
    v0 = (pvVar4->field_0).field_0.x;
    pvVar4 = std::vector<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>::operator[]
                       (&local_5a0,local_5d8);
    v1 = (pvVar4->field_0).field_0.y;
    pvVar4 = std::vector<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>::operator[]
                       (&local_5a0,local_5d8);
    v2 = (pvVar4->field_0).field_0.z;
    pvVar4 = std::vector<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>::operator[]
                       (&local_5a0,local_5d8);
    v3 = (pvVar4->field_0).field_0.w;
    in_R8 = (uchar *)(ulong)v3;
    SceneGraph::QuadMeshNode::Quad::Quad(&local_5e8,v0,v1,v2,v3);
    in_RSI = &local_5e8;
    std::
    vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
    ::push_back(in_stack_fffffffffffff780,(value_type *)in_stack_fffffffffffff778);
  }
  local_1b0 = local_3b8;
  SceneGraph::QuadMeshNode::verify(local_3b8[0],(EVP_PKEY_CTX *)in_RSI,sig,siglen,in_R8,in_R9);
  local_170 = local_3b8;
  local_160 = local_3b8[0];
  (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)local_3b8[0];
  if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
    (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
  }
  std::vector<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_>::~vector
            ((vector<embree::Vec4<int>,_std::allocator<embree::Vec4<int>_>_> *)
             in_stack_fffffffffffff790);
  local_150 = local_3b8;
  if (local_3b8[0] != (QuadMeshNode *)0x0) {
    (*(local_3b8[0]->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  local_1d0 = &local_370;
  if (local_370 != (long *)0x0) {
    (**(code **)(*local_370 + 0x18))();
  }
  return (Ref<embree::SceneGraph::Node>)in_RDI;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadQuadMesh(const Ref<XML>& xml) 
  {
    Ref<SceneGraph::MaterialNode> material = loadMaterial(xml->child("material"));
    Ref<SceneGraph::QuadMeshNode> mesh = new SceneGraph::QuadMeshNode(material,BBox1f(0,1),0);

    if (Ref<XML> animation = xml->childOpt("animated_positions")) {
      for (size_t i=0; i<animation->size(); i++)
        mesh->positions.push_back(loadVec3faArray(animation->child(i)));
    } else {
      mesh->positions.push_back(loadVec3faArray(xml->childOpt("positions")));
    }

    if (Ref<XML> animation = xml->childOpt("animated_normals")) {
      for (size_t i=0; i<animation->size(); i++)
        mesh->normals.push_back(loadVec3faArray(animation->child(i)));
    }
    else if (Ref<XML> normalbuf = xml->childOpt("normals")) {
      auto vec = loadVec3faArray(normalbuf);
      if (vec.size())
        for (size_t i=0; i<mesh->numTimeSteps(); i++)
          mesh->normals.push_back(vec);
    }
  
    mesh->texcoords = loadVec2fArray(xml->childOpt("texcoords"));

    std::vector<Vec4i> indices = loadVec4iArray(xml->childOpt("indices"));
    for (size_t i=0; i<indices.size(); i++) 
      mesh->quads.push_back(SceneGraph::QuadMeshNode::Quad(indices[i].x,indices[i].y,indices[i].z,indices[i].w));
    mesh->verify();
    return mesh.dynamicCast<SceneGraph::Node>();
  }